

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.c
# Opt level: O1

int uv__signal_loop_once_init(uv_loop_t *loop)

{
  int iVar1;
  
  if (loop->signal_pipefd[0] != -1) {
    return 0;
  }
  iVar1 = uv__make_pipe(loop->signal_pipefd,0x40);
  if (iVar1 == 0) {
    uv__io_init(&loop->signal_io_watcher,uv__signal_event,loop->signal_pipefd[0]);
    uv__io_start(loop,&loop->signal_io_watcher,1);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int uv__signal_loop_once_init(uv_loop_t* loop) {
  int err;

  /* Return if already initialized. */
  if (loop->signal_pipefd[0] != -1)
    return 0;

  err = uv__make_pipe(loop->signal_pipefd, UV_NONBLOCK_PIPE);
  if (err)
    return err;

  uv__io_init(&loop->signal_io_watcher,
              uv__signal_event,
              loop->signal_pipefd[0]);
  uv__io_start(loop, &loop->signal_io_watcher, POLLIN);

  return 0;
}